

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
llvm::
DenseMapIterator<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>,_false>
::RetreatPastEmptyBuckets
          (DenseMapIterator<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>,_false>
           *this)

{
  bool bVar1;
  KeyID *pKVar2;
  bool local_2a;
  bool local_29;
  KeyID local_20;
  KeyID Tombstone;
  KeyID Empty;
  DenseMapIterator<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>,_false>
  *this_local;
  
  if (this->End <= this->Ptr) {
    Tombstone = DenseMapInfo<llbuild::core::KeyID>::getEmptyKey();
    local_20 = DenseMapInfo<llbuild::core::KeyID>::getTombstoneKey();
    while( true ) {
      local_29 = false;
      if (this->Ptr != this->End) {
        pKVar2 = detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>::getFirst(this->Ptr + -1);
        bVar1 = DenseMapInfo<llbuild::core::KeyID>::isEqual(pKVar2,&Tombstone);
        local_2a = true;
        if (!bVar1) {
          pKVar2 = detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>::getFirst(this->Ptr + -1);
          local_2a = DenseMapInfo<llbuild::core::KeyID>::isEqual(pKVar2,&local_20);
        }
        local_29 = local_2a;
      }
      if (local_29 == false) break;
      this->Ptr = this->Ptr + -1;
    }
    return;
  }
  __assert_fail("Ptr >= End",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                ,0x4b7,
                "void llvm::DenseMapIterator<llbuild::core::KeyID, DBKeyID>::RetreatPastEmptyBuckets() [KeyT = llbuild::core::KeyID, ValueT = DBKeyID, KeyInfoT = llvm::DenseMapInfo<llbuild::core::KeyID>, Bucket = llvm::detail::DenseMapPair<llbuild::core::KeyID, DBKeyID>, IsConst = false]"
               );
}

Assistant:

void RetreatPastEmptyBuckets() {
    assert(Ptr >= End);
    const KeyT Empty = KeyInfoT::getEmptyKey();
    const KeyT Tombstone = KeyInfoT::getTombstoneKey();

    while (Ptr != End && (KeyInfoT::isEqual(Ptr[-1].getFirst(), Empty) ||
                          KeyInfoT::isEqual(Ptr[-1].getFirst(), Tombstone)))
      --Ptr;
  }